

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

int __thiscall
SVGChart::PlotDataContainer::GetPlotIndexByName(PlotDataContainer *this,string *inName)

{
  pointer ppLVar1;
  bool bVar2;
  __type_conflict _Var3;
  int theI;
  long lVar4;
  
  bVar2 = CheckState(this);
  if (bVar2) {
    for (lVar4 = 0;
        ppLVar1 = (this->mLegendDataList).
                  super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        lVar4 < (int)((ulong)((long)(this->mLegendDataList).
                                    super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar1) >> 3
                     ); lVar4 = lVar4 + 1) {
      _Var3 = std::operator==(&ppLVar1[lVar4]->mName,inName);
      if (_Var3) {
        return (int)lVar4;
      }
    }
  }
  return -1;
}

Assistant:

int PlotDataContainer::GetPlotIndexByName (const string &inName) const {

      if (CheckState ()) {
        for (int theI = 0; theI < int(mLegendDataList.size());theI++) {
          LegendData *theLegendData = mLegendDataList[theI];
          if (theLegendData->mName == inName) {
            return theI;
          }
        }
      }
      return -1;
    }